

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::
int_writer<char,fmt::v5::basic_format_specs<char>>::bin_writer<1>::operator()
          (bin_writer<1> *this,ostream_iterator<char,_char,_std::char_traits<char>_> *it)

{
  ostream_iterator<char,_char,_std::char_traits<char>_> *in_RSI;
  ostream_iterator<char,_char,_std::char_traits<char>_> *in_stack_00000038;
  ostream_iterator<char,_char,_std::char_traits<char>_> local_30;
  ostream_type *local_20;
  char *local_18;
  ostream_iterator<char,_char,_std::char_traits<char>_> *local_10;
  
  local_10 = in_RSI;
  std::ostream_iterator<char,_char,_std::char_traits<char>_>::ostream_iterator(&local_30,in_RSI);
  internal::
  format_uint<1u,char,std::ostream_iterator<char,char,std::char_traits<char>>,unsigned_int>
            (in_stack_00000038,this._4_4_,(int)this,it._7_1_);
  local_10->_M_stream = local_20;
  local_10->_M_string = local_18;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_uint<BITS, char_type>(it, abs_value, num_digits);
      }